

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_err.c
# Opt level: O0

void lj_err_run(lua_State *L)

{
  TValue *pTVar1;
  uint64_t uVar2;
  anon_struct_8_2_7fa0a05d_for_TValue_4 *paVar3;
  GCstr *pGVar4;
  long local_f8;
  TValue *top;
  TValue *errfunc;
  ptrdiff_t ef;
  lua_State *L_local;
  
  if (*(long *)((L->glref).ptr64 + 0x178) == 0) {
    local_f8 = finderrfunc(L);
  }
  else {
    local_f8 = 0;
  }
  if (local_f8 != 0) {
    paVar3 = (anon_struct_8_2_7fa0a05d_for_TValue_4 *)((L->stack).ptr64 + local_f8);
    pTVar1 = L->top;
    uVar2 = (L->glref).ptr64;
    *(uint *)(uVar2 + 0x3cc) = *(uint *)(uVar2 + 0x3cc) & 0xffffffef;
    if (((int)(*paVar3).it >> 0xf != -9) || (L->status == '\x05')) {
      pGVar4 = lj_err_str(L,LJ_ERR_ERRERR);
      pTVar1[-1].u64 = (ulong)pGVar4 | 0xfffd800000000000;
      lj_err_throw(L,5);
    }
    L->status = '\x05';
    pTVar1[1] = pTVar1[-1];
    pTVar1[-1].field_4 = *paVar3;
    pTVar1->u64 = 0xffffffffffffffff;
    L->top = pTVar1 + 2;
    lj_vm_call(L,pTVar1 + 1,2);
  }
  lj_err_throw(L,2);
}

Assistant:

LJ_FASTCALL lj_err_run(lua_State *L)
{
  ptrdiff_t ef = (LJ_HASJIT && tvref(G(L)->jit_base)) ? 0 : finderrfunc(L);
  if (ef) {
    TValue *errfunc = restorestack(L, ef);
    TValue *top = L->top;
    lj_trace_abort(G(L));
    if (!tvisfunc(errfunc) || L->status == LUA_ERRERR) {
      setstrV(L, top-1, lj_err_str(L, LJ_ERR_ERRERR));
      lj_err_throw(L, LUA_ERRERR);
    }
    L->status = LUA_ERRERR;
    copyTV(L, top+LJ_FR2, top-1);
    copyTV(L, top-1, errfunc);
    if (LJ_FR2) setnilV(top++);
    L->top = top+1;
    lj_vm_call(L, top, 1+1);  /* Stack: |errfunc|msg| -> |msg| */
  }
  lj_err_throw(L, LUA_ERRRUN);
}